

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::custom_op<long>::custom_function<MxxReduce_GlobalReduce_Test::TestBody()::__0>
               (long *param_1,int *param_2,MPI_Datatype *param_3,long *param_4)

{
  int iVar1;
  long local_68;
  MPI_Aint true_lb;
  MPI_Aint true_extent;
  long inout_buf;
  long in_buf;
  int *piStack_40;
  int i;
  long *inout;
  long *in;
  MPI_Datatype *dt_local;
  int *len_local;
  void *inoutvec_local;
  void *invec_local;
  
  in = param_4;
  dt_local = param_3;
  len_local = param_2;
  inoutvec_local = param_1;
  if (1 < *(int *)param_3) {
    in_buf._4_4_ = 0;
    piStack_40 = param_2;
    inout = param_1;
    while( true ) {
      if (*(int *)dt_local + -1 <= in_buf._4_4_) break;
      iVar1 = std::
              tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>_>
              ::type::operator()((void *)((long)&invec_local + 7),(int)inout[in_buf._4_4_],
                                 (int)*(undefined8 *)(piStack_40 + (long)in_buf._4_4_ * 2));
      *(long *)(piStack_40 + (long)in_buf._4_4_ * 2) = (long)iVar1;
      in_buf._4_4_ = in_buf._4_4_ + 1;
    }
  }
  MPI_Type_get_true_extent(*in,&local_68,&true_lb);
  memcpy((void *)((long)&inout_buf + local_68),
         (void *)((long)inoutvec_local + (long)(*(int *)dt_local + -1) * 8),true_lb);
  memcpy((void *)((long)&true_extent + local_68),len_local + (long)(*(int *)dt_local + -1) * 2,
         true_lb);
  iVar1 = std::
          tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>_>
          ::type::operator()((void *)((long)&invec_local + 7),(int)inout_buf,(int)true_extent);
  true_extent = (MPI_Aint)iVar1;
  memcpy(len_local + (long)(*(int *)dt_local + -1) * 2,(void *)((long)&true_extent + local_68),
         true_lb);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }